

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

void Sfm_DecStop(Sfm_Dec_t *p)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj;
  int *piVar3;
  word *pwVar4;
  void *pvVar5;
  void **ppvVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  
  pAVar2 = p->pNtk;
  pVVar8 = pAVar2->vObjs;
  if (0 < pVVar8->nSize) {
    uVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar8->pArray[uVar12];
      if (((pObj != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&pObj->field_0x14, (uVar1 & 0xf) == 7))
         && (uVar7 = Abc_ObjLevelNew(pObj), uVar1 >> 0xc != uVar7)) {
        printf("Level count mismatch at node %d.\n",uVar12 & 0xffffffff);
      }
      uVar12 = uVar12 + 1;
      pVVar8 = pAVar2->vObjs;
    } while ((long)uVar12 < (long)pVVar8->nSize);
  }
  Sfm_LibStop(p->pLib);
  if (p->pTim != (Sfm_Tim_t *)0x0) {
    Sfm_TimStop(p->pTim);
  }
  if (p->pMit != (Sfm_Mit_t *)0x0) {
    Sfm_MitStop(p->pMit);
  }
  lVar11 = 0x66;
  do {
    if (*(void **)(p->GateAnd + lVar11 * 2 + -0x1e) != (void *)0x0) {
      free(*(void **)(p->GateAnd + lVar11 * 2 + -0x1e));
      (p->GateAnd + lVar11 * 2 + -0x1e)[0] = 0;
      (p->GateAnd + lVar11 * 2 + -0x1e)[1] = 0;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x6e);
  piVar3 = (p->vGateSizes).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateSizes).pArray = (int *)0x0;
  }
  (p->vGateSizes).nCap = 0;
  (p->vGateSizes).nSize = 0;
  pwVar4 = (p->vGateFuncs).pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
    (p->vGateFuncs).pArray = (word *)0x0;
  }
  (p->vGateFuncs).nCap = 0;
  (p->vGateFuncs).nSize = 0;
  iVar9 = (p->vGateCnfs).nCap;
  pVVar10 = (p->vGateCnfs).pArray;
  if (iVar9 < 1) {
    if (pVVar10 != (Vec_Int_t *)0x0) goto LAB_0052532d;
  }
  else {
    lVar11 = 8;
    lVar13 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar10->nCap + lVar11);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        pVVar10 = (p->vGateCnfs).pArray;
        *(undefined8 *)((long)&pVVar10->nCap + lVar11) = 0;
        iVar9 = (p->vGateCnfs).nCap;
      }
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar13 < iVar9);
LAB_0052532d:
    free(pVVar10);
    (p->vGateCnfs).pArray = (Vec_Int_t *)0x0;
  }
  (p->vGateCnfs).nCap = 0;
  (p->vGateCnfs).nSize = 0;
  ppvVar6 = (p->vGateHands).pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
    (p->vGateHands).pArray = (void **)0x0;
  }
  (p->vGateHands).nCap = 0;
  (p->vGateHands).nSize = 0;
  piVar3 = (p->vObjRoots).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjRoots).pArray = (int *)0x0;
  }
  (p->vObjRoots).nCap = 0;
  (p->vObjRoots).nSize = 0;
  piVar3 = (p->vObjGates).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjGates).pArray = (int *)0x0;
  }
  (p->vObjGates).nCap = 0;
  (p->vObjGates).nSize = 0;
  iVar9 = (p->vObjFanins).nCap;
  pVVar10 = (p->vObjFanins).pArray;
  if (iVar9 < 1) {
    if (pVVar10 != (Vec_Int_t *)0x0) goto LAB_00525404;
  }
  else {
    lVar11 = 8;
    lVar13 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar10->nCap + lVar11);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        pVVar10 = (p->vObjFanins).pArray;
        *(undefined8 *)((long)&pVVar10->nCap + lVar11) = 0;
        iVar9 = (p->vObjFanins).nCap;
      }
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar13 < iVar9);
LAB_00525404:
    free(pVVar10);
    (p->vObjFanins).pArray = (Vec_Int_t *)0x0;
  }
  (p->vObjFanins).nCap = 0;
  (p->vObjFanins).nSize = 0;
  piVar3 = (p->vObjMap).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjMap).pArray = (int *)0x0;
  }
  (p->vObjMap).nCap = 0;
  (p->vObjMap).nSize = 0;
  piVar3 = (p->vObjDec).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjDec).pArray = (int *)0x0;
  }
  (p->vObjDec).nCap = 0;
  (p->vObjDec).nSize = 0;
  piVar3 = (p->vObjMffc).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjMffc).pArray = (int *)0x0;
  }
  (p->vObjMffc).nCap = 0;
  (p->vObjMffc).nSize = 0;
  piVar3 = (p->vObjInMffc).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vObjInMffc).pArray = (int *)0x0;
  }
  (p->vObjInMffc).nCap = 0;
  (p->vObjInMffc).nSize = 0;
  pwVar4 = (p->vObjSims).pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
    (p->vObjSims).pArray = (word *)0x0;
  }
  (p->vObjSims).nCap = 0;
  (p->vObjSims).nSize = 0;
  pwVar4 = (p->vObjSims2).pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
    (p->vObjSims2).pArray = (word *)0x0;
  }
  (p->vObjSims2).nCap = 0;
  (p->vObjSims2).nSize = 0;
  ppvVar6 = (p->vMatchGates).pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
    (p->vMatchGates).pArray = (void **)0x0;
  }
  (p->vMatchGates).nCap = 0;
  (p->vMatchGates).nSize = 0;
  ppvVar6 = (p->vMatchFans).pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
    (p->vMatchFans).pArray = (void **)0x0;
  }
  (p->vMatchFans).nCap = 0;
  (p->vMatchFans).nSize = 0;
  sat_solver_delete(p->pSat);
  iVar9 = (p->vClauses).nCap;
  pVVar10 = (p->vClauses).pArray;
  if (iVar9 < 1) {
    if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_005255c9;
  }
  else {
    lVar11 = 8;
    lVar13 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar10->nCap + lVar11);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        pVVar10 = (p->vClauses).pArray;
        *(undefined8 *)((long)&pVVar10->nCap + lVar11) = 0;
        iVar9 = (p->vClauses).nCap;
      }
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar13 < iVar9);
  }
  free(pVVar10);
  (p->vClauses).pArray = (Vec_Int_t *)0x0;
LAB_005255c9:
  (p->vClauses).nCap = 0;
  (p->vClauses).nSize = 0;
  piVar3 = p->vImpls[0].pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    p->vImpls[0].pArray = (int *)0x0;
  }
  p->vImpls[0].nCap = 0;
  p->vImpls[0].nSize = 0;
  piVar3 = p->vImpls[1].pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    p->vImpls[1].pArray = (int *)0x0;
  }
  p->vImpls[1].nCap = 0;
  p->vImpls[1].nSize = 0;
  pwVar4 = p->vSets[0].pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
    p->vSets[0].pArray = (word *)0x0;
  }
  p->vSets[0].nCap = 0;
  p->vSets[0].nSize = 0;
  pwVar4 = p->vSets[1].pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
    p->vSets[1].pArray = (word *)0x0;
  }
  p->vSets[1].nCap = 0;
  p->vSets[1].nSize = 0;
  piVar3 = (p->vNewNodes).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vNewNodes).pArray = (int *)0x0;
  }
  (p->vNewNodes).nCap = 0;
  (p->vNewNodes).nSize = 0;
  piVar3 = (p->vGateTfi).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateTfi).pArray = (int *)0x0;
  }
  (p->vGateTfi).nCap = 0;
  (p->vGateTfi).nSize = 0;
  piVar3 = (p->vGateTfo).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateTfo).pArray = (int *)0x0;
  }
  (p->vGateTfo).nCap = 0;
  (p->vGateTfo).nSize = 0;
  piVar3 = (p->vGateCut).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateCut).pArray = (int *)0x0;
  }
  (p->vGateCut).nCap = 0;
  (p->vGateCut).nSize = 0;
  piVar3 = (p->vGateTemp).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateTemp).pArray = (int *)0x0;
  }
  (p->vGateTemp).nCap = 0;
  (p->vGateTemp).nSize = 0;
  piVar3 = (p->vGateMffc).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vGateMffc).pArray = (int *)0x0;
  }
  (p->vGateMffc).nCap = 0;
  (p->vGateMffc).nSize = 0;
  piVar3 = (p->vCands).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(p);
  pAVar2->pData = (void *)0x0;
  return;
}

Assistant:

void Sfm_DecStop( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level count mismatch at node %d.\n", i );
    Sfm_LibStop( p->pLib );
    if ( p->pTim ) Sfm_TimStop( p->pTim );
    if ( p->pMit ) Sfm_MitStop( p->pMit );
    // divisors
    for ( i = 0; i < SFM_SUPP_MAX; i++ )
        ABC_FREE( p->pDivWords[i] );
    // library
    Vec_IntErase( &p->vGateSizes );
    Vec_WrdErase( &p->vGateFuncs );
    Vec_WecErase( &p->vGateCnfs );
    Vec_PtrErase( &p->vGateHands );
    // objects
    Vec_IntErase( &p->vObjRoots );
    Vec_IntErase( &p->vObjGates );
    Vec_WecErase( &p->vObjFanins );
    Vec_IntErase( &p->vObjMap );
    Vec_IntErase( &p->vObjDec );
    Vec_IntErase( &p->vObjMffc );
    Vec_IntErase( &p->vObjInMffc );
    Vec_WrdErase( &p->vObjSims );
    Vec_WrdErase( &p->vObjSims2 );
    Vec_PtrErase( &p->vMatchGates );
    Vec_PtrErase( &p->vMatchFans );
    // solver
    sat_solver_delete( p->pSat );
    Vec_WecErase( &p->vClauses );
    Vec_IntErase( &p->vImpls[0] );
    Vec_IntErase( &p->vImpls[1] );
    Vec_WrdErase( &p->vSets[0] );
    Vec_WrdErase( &p->vSets[1] );
    // temporary
    Vec_IntErase( &p->vNewNodes );
    Vec_IntErase( &p->vGateTfi );
    Vec_IntErase( &p->vGateTfo );
    Vec_IntErase( &p->vGateCut );
    Vec_IntErase( &p->vGateTemp );
    Vec_IntErase( &p->vGateMffc );
    Vec_IntErase( &p->vCands );
    ABC_FREE( p );
    pNtk->pData = NULL;
}